

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O1

ON_wString __thiscall
ON_FileSystemPath::RemoveFileName(ON_FileSystemPath *this,wchar_t *path,ON_wString *file_name)

{
  int length;
  wchar_t *path_00;
  ON_wString local_path;
  wchar_t *fname;
  wchar_t *dir;
  wchar_t *vol;
  
  CleanPath((ON_FileSystemPath *)&local_path,true,true,true,true,false,L'/',path);
  path_00 = ON_wString::operator_cast_to_wchar_t_(&local_path);
  vol = (wchar_t *)0x0;
  dir = (wchar_t *)0x0;
  fname = (wchar_t *)0x0;
  on_wsplitpath(path_00,&vol,&dir,&fname,(wchar_t **)0x0);
  if (((fname < path_00) || (path_00 == (wchar_t *)0x0)) || (fname == (wchar_t *)0x0)) {
    length = ON_wString::Length(&local_path);
  }
  else {
    length = (int)((ulong)((long)fname - (long)path_00) >> 2);
  }
  if (file_name != (ON_wString *)0x0) {
    ON_wString::operator=(file_name,fname);
  }
  ON_wString::ON_wString((ON_wString *)this,path_00,length);
  ON_wString::~ON_wString(&local_path);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_FileSystemPath::RemoveFileName(
  const wchar_t* path,
  ON_wString* file_name
)
{
  const ON_wString local_path = ON_FileSystemPath::CleanPath(path);
  path = static_cast<const wchar_t*>(local_path);
  const wchar_t* vol = nullptr;
  const wchar_t* dir = nullptr;
  const wchar_t* fname = nullptr;
  on_wsplitpath(path, &vol, &dir, &fname, nullptr);
  
  const size_t length
    = (nullptr != fname && nullptr != path && path <= fname)
    ? (int)(fname - path)
    : local_path.Length();

  if (nullptr != file_name)
    *file_name = fname;

  return ON_wString(path,(int)length);
}